

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int unqlite_util_random_string(unqlite *pDb,char *zBuf,uint buf_size)

{
  int iVar1;
  ulong uVar2;
  
  iVar1 = -0x18;
  if (((pDb != (unqlite *)0x0) && (pDb->nMagic == 0xdb7c2712)) &&
     (iVar1 = -9, 2 < buf_size && zBuf != (char *)0x0)) {
    SyRandomness(&((pDb->sDB).pPager)->sPrng,zBuf,buf_size);
    iVar1 = 0;
    uVar2 = 0;
    do {
      zBuf[uVar2] = "abcdefghijklmnopqrstuvwxyz"[(ulong)(long)zBuf[uVar2] % 0x1a];
      uVar2 = uVar2 + 1;
    } while (buf_size != uVar2);
  }
  return iVar1;
}

Assistant:

UNQLITE_APIEXPORT int unqlite_util_random_string(unqlite *pDb,char *zBuf,unsigned int buf_size)
{
	if( UNQLITE_DB_MISUSE(pDb) ){
		return UNQLITE_CORRUPT;
	}
	if( zBuf == 0 || buf_size < 3 ){
		/* Buffer must be long enough to hold three bytes */
		return UNQLITE_INVALID;
	}
#if defined(UNQLITE_ENABLE_THREADS)
	 /* Acquire DB mutex */
	 SyMutexEnter(sUnqlMPGlobal.pMutexMethods, pDb->pMutex); /* NO-OP if sUnqlMPGlobal.nThreadingLevel != UNQLITE_THREAD_LEVEL_MULTI */
	 if( sUnqlMPGlobal.nThreadingLevel > UNQLITE_THREAD_LEVEL_SINGLE && 
		 UNQLITE_THRD_DB_RELEASE(pDb) ){
			 return UNQLITE_ABORT; /* Another thread have released this instance */
	 }
#endif
	 /* Generate the random string */
	 unqlitePagerRandomString(pDb->sDB.pPager,zBuf,buf_size);
#if defined(UNQLITE_ENABLE_THREADS)
	 /* Leave DB mutex */
	 SyMutexLeave(sUnqlMPGlobal.pMutexMethods,pDb->pMutex); /* NO-OP if sUnqlMPGlobal.nThreadingLevel != UNQLITE_THREAD_LEVEL_MULTI */
#endif
	 return UNQLITE_OK;
}